

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O2

void ym2612_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN2 *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  undefined1 (*pauVar1) [16];
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  DEV_SMPL *local_68;
  DEV_SMPL *local_60;
  
  iVar2 = 0;
  if (buffer == (DEV_SMPL **)0x0) {
    local_60 = (DEV_SMPL *)0x0;
    local_68 = (DEV_SMPL *)0x0;
  }
  else {
    local_68 = *buffer;
    local_60 = buffer[1];
  }
  OPN = (FM_OPN2 *)((long)chip + 0x208);
  CH = (FM_CH *)((long)chip + 0x4718);
  CH_00 = (FM_CH *)((long)chip + 0x48b0);
  if (*(char *)((long)chip + 0x50b0) == '\0') {
    iVar2 = *(int *)((long)chip + 0x50ac) << 5;
  }
  CH_01 = (FM_CH *)((long)chip + 0x4a48);
  CH_02 = (FM_CH *)((long)chip + 0x4be0);
  CH_03 = (FM_CH *)((long)chip + 0x4d78);
  CH_04 = (FM_CH *)((long)chip + 0x4f10);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x234) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4a70) == -1) {
    refresh_fc_eg_slot(OPN,(FM_SLOT *)CH_01,*(int *)((long)chip + 0x66c),
                       (uint)*(byte *)((long)chip + 0x676));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4ae8),*(int *)((long)chip + 0x670),
                       (uint)*(byte *)((long)chip + 0x677));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4a98),*(int *)((long)chip + 0x668),
                       (uint)*(byte *)((long)chip + 0x675));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4b38),*(int *)((long)chip + 0x4bcc),
                       (uint)*(byte *)((long)chip + 0x4bd0));
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
  }
  pauVar1 = (undefined1 (*) [16])((long)chip + 0x46fc);
  for (uVar7 = 0; uVar7 != length; uVar7 = uVar7 + 1) {
    *pauVar1 = (undefined1  [16])0x0;
    *(undefined8 *)((long)chip + 0x470c) = 0;
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
    if (*(char *)((long)chip + 0x50aa) == '\0') {
      chan_calc((YM2612 *)chip,OPN,CH);
      chan_calc((YM2612 *)chip,OPN,CH_00);
      chan_calc((YM2612 *)chip,OPN,CH_01);
      chan_calc((YM2612 *)chip,OPN,CH_02);
      chan_calc((YM2612 *)chip,OPN,CH_03);
      if (*(char *)((long)chip + 0x50a9) == '\0') {
        chan_calc((YM2612 *)chip,OPN,CH_04);
      }
      else {
        **(int **)((long)chip + 0x5078) = **(int **)((long)chip + 0x5078) + iVar2;
      }
    }
    else {
      *(ulong *)((long)chip + 0x46fc) = CONCAT44(iVar2,iVar2);
      *(ulong *)((long)chip + 0x4704) = CONCAT44(iVar2,iVar2);
      *(int *)((long)chip + 0x4710) = iVar2;
    }
    uVar3 = *(uint *)((long)chip + 0x46e0);
    if (uVar3 != 0) {
      uVar9 = *(int *)((long)chip + 0x46d8) + *(int *)((long)chip + 0x46dc);
      *(uint *)((long)chip + 0x46d8) = uVar9;
      while (uVar3 <= uVar9) {
        *(uint *)((long)chip + 0x46d8) = uVar9 - uVar3;
        bVar8 = *(char *)((long)chip + 0x46d4) + 1;
        bVar13 = bVar8 & 0x7f;
        *(byte *)((long)chip + 0x46d4) = bVar13;
        uVar10 = (uint)(byte)(bVar8 * '\x02');
        uVar11 = uVar10 ^ 0x7e;
        if (0x3f < bVar13) {
          uVar11 = uVar10 & 0x7e;
        }
        *(uint *)((long)chip + 0x46e4) = uVar11;
        *(uint *)((long)chip + 0x46e8) = (uint)(bVar13 >> 2);
        uVar9 = uVar9 - uVar3;
      }
    }
    uVar3 = *(int *)((long)chip + 0x6c4) + *(int *)((long)chip + 0x6c8);
    *(uint *)((long)chip + 0x6c4) = uVar3;
    while (*(uint *)((long)chip + 0x6cc) <= uVar3) {
      *(uint *)((long)chip + 0x6c4) = uVar3 - *(uint *)((long)chip + 0x6cc);
      *(int *)((long)chip + 0x6c0) = *(int *)((long)chip + 0x6c0) + 1;
      advance_eg_channel(OPN,(FM_SLOT *)CH);
      advance_eg_channel(OPN,(FM_SLOT *)CH_00);
      advance_eg_channel(OPN,(FM_SLOT *)CH_01);
      advance_eg_channel(OPN,(FM_SLOT *)CH_02);
      advance_eg_channel(OPN,(FM_SLOT *)CH_03);
      advance_eg_channel(OPN,(FM_SLOT *)CH_04);
      uVar3 = *(uint *)((long)chip + 0x6c4);
    }
    uVar3 = *(uint *)*pauVar1;
    uVar9 = 0x2000;
    if ((0x2000 < (int)uVar3) || (uVar9 = 0xffffe000, (int)uVar3 < -0x2000)) {
      uVar3 = uVar9;
      *(uint *)*pauVar1 = uVar3;
    }
    uVar9 = *(uint *)((long)chip + 0x4700);
    uVar11 = 0x2000;
    if ((0x2000 < (int)uVar9) || (uVar11 = 0xffffe000, (int)uVar9 < -0x2000)) {
      uVar9 = uVar11;
      *(uint *)((long)chip + 0x4700) = uVar9;
    }
    uVar11 = *(uint *)((long)chip + 0x4704);
    uVar10 = 0x2000;
    if ((0x2000 < (int)uVar11) || (uVar10 = 0xffffe000, (int)uVar11 < -0x2000)) {
      uVar11 = uVar10;
      *(uint *)((long)chip + 0x4704) = uVar11;
    }
    uVar10 = *(uint *)((long)chip + 0x4708);
    uVar15 = 0x2000;
    if ((0x2000 < (int)uVar10) || (uVar15 = 0xffffe000, (int)uVar10 < -0x2000)) {
      uVar10 = uVar15;
      *(uint *)((long)chip + 0x4708) = uVar10;
    }
    uVar15 = *(uint *)((long)chip + 0x470c);
    uVar12 = 0x2000;
    if ((0x2000 < (int)uVar15) || (uVar12 = 0xffffe000, (int)uVar15 < -0x2000)) {
      uVar15 = uVar12;
      *(uint *)((long)chip + 0x470c) = uVar15;
    }
    uVar12 = *(uint *)((long)chip + 0x4710);
    uVar14 = 0x2000;
    if ((0x2000 < (int)uVar12) || (uVar14 = 0xffffe000, (int)uVar12 < -0x2000)) {
      uVar12 = uVar14;
      *(uint *)((long)chip + 0x4710) = uVar12;
    }
    iVar6 = (uVar10 & *(uint *)((long)chip + 0x6ac)) + (uVar11 & *(uint *)((long)chip + 0x6a4)) +
            (uVar9 & *(uint *)((long)chip + 0x69c)) + (uVar3 & *(uint *)((long)chip + 0x694));
    uVar14 = iVar2 * 2;
    if (*(char *)((long)chip + 0x50aa) == '\0') {
      iVar6 = iVar6 + (uVar15 & *(uint *)((long)chip + 0x6b4));
      uVar14 = *(uint *)((long)chip + 0x6b0) & uVar15;
    }
    iVar4 = (*(uint *)((long)chip + 0x6b8) & uVar12) + uVar14 +
            (*(uint *)((long)chip + 0x6a0) & uVar11) + (*(uint *)((long)chip + 0x6a8) & uVar10) +
            (*(uint *)((long)chip + 0x698) & uVar9) + (*(uint *)((long)chip + 0x690) & uVar3);
    iVar6 = (uVar12 & *(uint *)((long)chip + 0x6bc)) + iVar6;
    bVar8 = *(byte *)((long)chip + 0x50b1);
    if (bVar8 == 0) {
      *(int *)((long)chip + 0x50b4) = iVar4;
      *(int *)((long)chip + 0x50b8) = iVar6;
    }
    else {
      if ((bVar8 & 1) != 0) {
        *(int *)((long)chip + 0x50b4) = iVar4;
      }
      if ((bVar8 & 2) != 0) {
        *(int *)((long)chip + 0x50b8) = iVar6;
      }
      *(byte *)((long)chip + 0x50b1) = bVar8 ^ 3;
      iVar4 = *(int *)((long)chip + 0x50b4);
    }
    local_68[uVar7] = iVar4;
    local_60[uVar7] = *(DEV_SMPL *)((long)chip + 0x50b8);
    *(char *)((long)chip + 0x684) = *(char *)((long)chip + 0x684) << 1;
    iVar6 = *(int *)((long)chip + 0x240);
    if ((((iVar6 != 0) && (*(long *)((long)chip + 0x650) == 0)) &&
        (iVar5 = (int)(*(double *)((long)chip + 0x218) * 4096.0), iVar4 = iVar6 - iVar5,
        *(int *)((long)chip + 0x240) = iVar4, iVar4 == 0 || iVar6 < iVar5)) &&
       (TimerAOver((FM_ST2 *)((long)chip + 0x210)), (*(byte *)((long)chip + 0x234) & 0x80) != 0)) {
      CSMKeyControll(OPN,CH_01);
    }
    if ((*(byte *)((long)chip + 0x684) & 2) != 0) {
      FM_KEYOFF_CSM(CH_01,0);
      FM_KEYOFF_CSM(CH_01,2);
      FM_KEYOFF_CSM(CH_01,1);
      FM_KEYOFF_CSM(CH_01,3);
      *(undefined1 *)((long)chip + 0x684) = 0;
    }
  }
  iVar2 = *(int *)((long)chip + 0x248);
  if (((iVar2 != 0) && (*(long *)((long)chip + 0x650) == 0)) &&
     (iVar4 = (int)((double)length * *(double *)((long)chip + 0x218) * 4096.0),
     iVar6 = iVar2 - iVar4, *(int *)((long)chip + 0x248) = iVar6, iVar6 == 0 || iVar2 < iVar4)) {
    TimerBOver((FM_ST2 *)((long)chip + 0x210));
    return;
  }
  return;
}

Assistant:

void ym2612_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN2 *OPN  = &F2612->OPN;
	INT32 *out_fm = OPN->out_fm;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	INT32 dacout;
	FM_CH   *cch[6];
	INT32 lt,rt;

	/* set buffer */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		// for internal 0-sample update
		bufL = bufR = NULL;
	}

	cch[0]   = &F2612->CH[0];
	cch[1]   = &F2612->CH[1];
	cch[2]   = &F2612->CH[2];
	cch[3]   = &F2612->CH[3];
	cch[4]   = &F2612->CH[4];
	cch[5]   = &F2612->CH[5];
	
	if (! F2612->MuteDAC)
		dacout = F2612->dacout << 5;    /* level unknown */
	else
		dacout = 0;

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}else refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}


	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		if (! F2612->dac_test)
		{
			chan_calc(F2612, OPN, cch[0]);
			chan_calc(F2612, OPN, cch[1]);
			chan_calc(F2612, OPN, cch[2]);
			chan_calc(F2612, OPN, cch[3]);
			chan_calc(F2612, OPN, cch[4]);
			if( F2612->dacen )
				*cch[5]->connect4 += dacout;
			else
				chan_calc(F2612, OPN, cch[5]);
		}
		else
		{
			out_fm[0] = out_fm[1] = dacout;
			out_fm[2] = out_fm[3] = dacout;
			out_fm[5] = dacout;
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}

		if (out_fm[0] > 8192) out_fm[0] = 8192;
		else if (out_fm[0] < -8192) out_fm[0] = -8192;
		if (out_fm[1] > 8192) out_fm[1] = 8192;
		else if (out_fm[1] < -8192) out_fm[1] = -8192;
		if (out_fm[2] > 8192) out_fm[2] = 8192;
		else if (out_fm[2] < -8192) out_fm[2] = -8192;
		if (out_fm[3] > 8192) out_fm[3] = 8192;
		else if (out_fm[3] < -8192) out_fm[3] = -8192;
		if (out_fm[4] > 8192) out_fm[4] = 8192;
		else if (out_fm[4] < -8192) out_fm[4] = -8192;
		if (out_fm[5] > 8192) out_fm[5] = 8192;
		else if (out_fm[5] < -8192) out_fm[5] = -8192;

		/* 6-channels mixing  */
		lt  = ((out_fm[0]>>0) & OPN->pan[0]);
		rt  = ((out_fm[0]>>0) & OPN->pan[1]);
		lt += ((out_fm[1]>>0) & OPN->pan[2]);
		rt += ((out_fm[1]>>0) & OPN->pan[3]);
		lt += ((out_fm[2]>>0) & OPN->pan[4]);
		rt += ((out_fm[2]>>0) & OPN->pan[5]);
		lt += ((out_fm[3]>>0) & OPN->pan[6]);
		rt += ((out_fm[3]>>0) & OPN->pan[7]);
		if (! F2612->dac_test)
		{
			lt += ((out_fm[4]>>0) & OPN->pan[8]);
			rt += ((out_fm[4]>>0) & OPN->pan[9]);
		}
		else
		{
			// DAC test mode ignores panning for channel 4
			lt += dacout;
			lt += dacout;
		}
		lt += ((out_fm[5]>>0) & OPN->pan[10]);
		rt += ((out_fm[5]>>0) & OPN->pan[11]);

		/* buffering */
		if (F2612->WaveOutMode)
		{
			if (F2612->WaveOutMode & 0x01)
				F2612->WaveL = lt;
			if (F2612->WaveOutMode & 0x02)
				F2612->WaveR = rt;
			F2612->WaveOutMode ^= 0x03;
		}
		else
		{
			F2612->WaveL = lt;
			F2612->WaveR = rt;
		}
		bufL[i] = F2612->WaveL;
		bufR[i] = F2612->WaveR;

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		//INTERNAL_TIMER_A( &OPN->ST , cch[2] )
		{
			if( OPN->ST.TAC && (OPN->ST.timer_handler==0) )
				if( (OPN->ST.TAC -= (int)(OPN->ST.freqbase*4096)) <= 0 )
				{
					TimerAOver( &OPN->ST );
					// CSM mode total level latch and auto key on
					if( OPN->ST.mode & 0x80 )
						CSMKeyControll( OPN, cch[2] );
				}
		}

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}